

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::HlslParseContext::handleInputGeometry
          (HlslParseContext *this,TSourceLoc *loc,TLayoutGeometry *geometry)

{
  TLayoutGeometry TVar1;
  TLayoutGeometry TVar2;
  TIntermediate *pTVar3;
  char *pcVar4;
  char *pcVar5;
  _func_int **pp_Var6;
  
  if (this->parsingEntrypointParameters != true) {
    return true;
  }
  TVar1 = *geometry;
  switch(TVar1) {
  case ElgPoints:
  case ElgLines:
  case ElgLinesAdjacency:
  case ElgTriangles:
  case ElgTrianglesAdjacency:
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    TVar2 = pTVar3->inputPrimitive;
    if (TVar2 == ElgNone) {
      pTVar3->inputPrimitive = TVar1;
      return true;
    }
    if (TVar2 == TVar1) {
      return true;
    }
    if (*geometry - ElgPoints < 9) {
      pcVar4 = *(char **)(&DAT_00b09ee8 + (ulong)(*geometry - ElgPoints) * 8);
    }
    else {
      pcVar4 = "none";
    }
    pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "input primitive geometry redefinition";
    goto LAB_0042115f;
  case ElgLineStrip:
    pcVar4 = "line_strip";
    break;
  case ElgTriangleStrip:
    pcVar4 = "triangle_strip";
    break;
  case ElgQuads:
    pcVar4 = "quads";
    break;
  case ElgIsolines:
    pcVar4 = "isolines";
    break;
  default:
    pcVar4 = "none";
  }
  pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar5 = "cannot apply to \'in\'";
LAB_0042115f:
  (*pp_Var6[0x2d])(this,loc,pcVar5,pcVar4,"");
  return false;
}

Assistant:

bool HlslParseContext::handleInputGeometry(const TSourceLoc& loc, const TLayoutGeometry& geometry)
{
    // these can be declared on non-entry-points, in which case they lose their meaning
    if (! parsingEntrypointParameters)
        return true;

    switch (geometry) {
    case ElgPoints:             // fall through
    case ElgLines:              // ...
    case ElgTriangles:          // ...
    case ElgLinesAdjacency:     // ...
    case ElgTrianglesAdjacency: // ...
        if (! intermediate.setInputPrimitive(geometry)) {
            error(loc, "input primitive geometry redefinition", TQualifier::getGeometryString(geometry), "");
            return false;
        }
        break;

    default:
        error(loc, "cannot apply to 'in'", TQualifier::getGeometryString(geometry), "");
        return false;
    }

    return true;
}